

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
argstest::FlagBase::GetProgramLine_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,FlagBase *this,HelpParams *params)

{
  int iVar1;
  undefined4 extraout_var;
  long extraout_RDX;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string res;
  string postfix;
  EitherFlag flag;
  
  if (params->proglineShowFlags == false) {
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    iVar1 = (*(this->super_NamedBase).super_Base._vptr_Base[0x15])(this);
    if (extraout_RDX == 0 && CONCAT44(extraout_var,iVar1) == 0) {
      postfix._M_dataplus._M_p = (pointer)&postfix.field_2;
      postfix._M_string_length = 0;
      postfix.field_2._M_local_buf[0] = '\0';
    }
    else {
      (*(this->super_NamedBase).super_Base._vptr_Base[0x14])(&postfix,this);
    }
    if (params->proglinePreferShortFlags == true) {
      Matcher::GetShortOrAny(&flag,&this->matcher);
    }
    else {
      Matcher::GetLongOrAny(&flag,&this->matcher);
    }
    EitherFlag::str(&res,&flag,&params->shortPrefix,&params->longPrefix);
    if (postfix._M_string_length != 0) {
      std::operator+(&local_c8,&params->proglineValueOpen,&postfix);
      std::operator+(&local_a8,&local_c8,&params->proglineValueClose);
      std::__cxx11::string::append((string *)&res);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    if (((this->super_NamedBase).super_Base.options & Required) == None) {
      std::operator+(&local_c8,&params->proglineNonrequiredOpen,&res);
      std::operator+(&local_a8,&local_c8,&params->proglineNonrequiredClose);
    }
    else {
      std::operator+(&local_c8,&params->proglineRequiredOpen,&res);
      std::operator+(&local_a8,&local_c8,&params->proglineRequiredClose);
    }
    __l._M_len = 1;
    __l._M_array = &local_a8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,__l,&local_c9);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&res);
    std::__cxx11::string::~string((string *)&flag.longFlag);
    std::__cxx11::string::~string((string *)&postfix);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<std::string> GetProgramLine(const HelpParams &params) const override
            {
                if (!params.proglineShowFlags)
                {
                    return {};
                }

                const std::string postfix = NumberOfArguments() == 0 ? std::string() : Name();
                const EitherFlag flag = params.proglinePreferShortFlags ? matcher.GetShortOrAny() : matcher.GetLongOrAny();
                std::string res = flag.str(params.shortPrefix, params.longPrefix);
                if (!postfix.empty())
                {
                    res += params.proglineValueOpen + postfix + params.proglineValueClose;
                }

                return { IsRequired() ? params.proglineRequiredOpen + res + params.proglineRequiredClose
                                      : params.proglineNonrequiredOpen + res + params.proglineNonrequiredClose };
            }